

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRExpression * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::allocate<char_const(&)[1],unsigned_int&,bool>
          (ObjectPool<spirv_cross::SPIRExpression> *this,char (*p) [1],uint *p_1,bool *p_2)

{
  uint uVar1;
  SPIRExpression *this_00;
  uint *puVar2;
  bool bVar3;
  size_t sVar4;
  SPIRExpression **ppSVar5;
  TypeID local_90 [5];
  allocator local_79;
  string local_78 [32];
  SPIRExpression *local_58;
  SPIRExpression *ptr;
  uint local_44;
  SPIRExpression *pSStack_40;
  uint i;
  SPIRExpression *ptr_1;
  bool *pbStack_30;
  uint num_objects;
  bool *p_local_2;
  uint *p_local_1;
  char (*p_local) [1];
  ObjectPool<spirv_cross::SPIRExpression> *this_local;
  
  pbStack_30 = p_2;
  p_local_2 = (bool *)p_1;
  p_local_1 = (uint *)p;
  p_local = (char (*) [1])this;
  bVar3 = VectorView<spirv_cross::SPIRExpression_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>);
  if (bVar3) {
    uVar1 = this->start_object_count;
    sVar4 = VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar4 & 0x1f);
    pSStack_40 = (SPIRExpression *)malloc((ulong)ptr_1._4_4_ * 0xb8);
    if (pSStack_40 == (SPIRExpression *)0x0) {
      return (SPIRExpression *)0x0;
    }
    for (local_44 = 0; local_44 < ptr_1._4_4_; local_44 = local_44 + 1) {
      ptr = pSStack_40 + local_44;
      SmallVector<spirv_cross::SPIRExpression_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRExpression,spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRExpression*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRExpression,spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffc0);
  }
  ppSVar5 = VectorView<spirv_cross::SPIRExpression_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>);
  local_58 = *ppSVar5;
  SmallVector<spirv_cross::SPIRExpression_*,_0UL>::pop_back(&this->vacants);
  puVar2 = p_local_1;
  this_00 = local_58;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_78,(char *)puVar2,&local_79);
  TypedID<(spirv_cross::Types)1>::TypedID(local_90,*(uint32_t *)p_local_2);
  SPIRExpression::SPIRExpression(this_00,(string *)local_78,local_90[0],(bool)(*pbStack_30 & 1));
  ::std::__cxx11::string::~string(local_78);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return local_58;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}